

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_heap.h
# Opt level: O0

void __thiscall merlin::indexed_heap::erase(indexed_heap *this,size_t r)

{
  size_t i;
  reference pvVar1;
  size_t sVar2;
  size_t I;
  size_t r_local;
  indexed_heap *this_local;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_rev,r);
  i = *pvVar1;
  if (i != 0) {
    sVar2 = size(this);
    if (i == sVar2) {
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_rev,r);
      *pvVar1 = 0;
      std::vector<double,_std::allocator<double>_>::pop_back(&this->m_p);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->m_id);
    }
    else {
      sVar2 = size(this);
      heap_swap(this,i,sVar2);
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_rev,r);
      *pvVar1 = 0;
      std::vector<double,_std::allocator<double>_>::pop_back(&this->m_p);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->m_id);
      max_heapify(this,i);
    }
  }
  return;
}

Assistant:

void erase(size_t r) {
		size_t I = m_rev[r];
		if (I == 0)
			return;		// already gone
		if (I == size()) {
			m_rev[r] = 0;
			m_p.pop_back();
			m_id.pop_back();
		} else {
			heap_swap(I, size());
			m_rev[r] = 0;
			m_p.pop_back();
			m_id.pop_back();
			max_heapify(I);
		}
	}